

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack15_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x7fff) + base;
  out[1] = (*in >> 0xf & 0x7fff) + base;
  uVar1 = *in;
  out[2] = uVar1 >> 0x1e;
  out[2] = (uVar1 >> 0x1e) + base + (in[1] & 0x1fff) * 4;
  out[3] = (in[1] >> 0xd & 0x7fff) + base;
  uVar1 = in[1];
  out[4] = uVar1 >> 0x1c;
  out[4] = (uVar1 >> 0x1c) + base + (in[2] & 0x7ff) * 0x10;
  out[5] = (in[2] >> 0xb & 0x7fff) + base;
  uVar1 = in[2];
  out[6] = uVar1 >> 0x1a;
  out[6] = (uVar1 >> 0x1a) + base + (in[3] & 0x1ff) * 0x40;
  out[7] = (in[3] >> 9 & 0x7fff) + base;
  return in + 4;
}

Assistant:

uint32_t * unpack15_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 13 ))<<( 15 - 13 );
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 11 ))<<( 15 - 11 );
    *out += base;
    out++;
    *out = ( (*in) >>  11  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 9 ))<<( 15 - 9 );
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 15 )  ;
    *out += base;
    out++;

    return in + 1;
}